

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

UniValue * __thiscall RPCHelpMan::GetArgMap(UniValue *__return_storage_ptr__,RPCHelpMan *this)

{
  pointer pRVar1;
  string str;
  pointer pbVar2;
  pointer pbVar3;
  const_reference pvVar4;
  pointer arg_name;
  Type *type;
  pointer pRVar5;
  Type *in_R8;
  string *inner_name;
  pointer arg_name_00;
  size_type __n;
  long in_FS_OFFSET;
  string_view str_00;
  string_view str_01;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  vector<RPCArg,_std::allocator<RPCArg>_> *this_00;
  undefined8 in_stack_ffffffffffffff40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inner_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_names;
  anon_class_8_1_ba1d35c1 push_back_arg_info;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  str._M_string_length = in_stack_ffffffffffffff30;
  str._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff28;
  str.field_2._M_allocated_capacity = in_stack_ffffffffffffff38;
  str.field_2._8_8_ = in_stack_ffffffffffffff40;
  UniValue::UniValue(__return_storage_ptr__,VARR,str);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = &this->m_args;
  push_back_arg_info.arr = __return_storage_ptr__;
  for (__n = 0; (long)__n <
                (long)(int)(((long)(this->m_args).
                                   super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x108); __n = __n + 1
      ) {
    pvVar4 = std::vector<RPCArg,_std::allocator<RPCArg>_>::at(this_00,__n);
    str_00._M_str = (char *)0x7c;
    str_00._M_len = (size_t)(pvVar4->m_names)._M_dataplus._M_p;
    util::SplitString_abi_cxx11_
              (&arg_names,(util *)(pvVar4->m_names)._M_string_length,str_00,(char)in_R8);
    pbVar3 = arg_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    type = &pvVar4->m_type;
    for (arg_name = arg_names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; arg_name != pbVar3;
        arg_name = arg_name + 1) {
      in_R8 = type;
      GetArgMap::anon_class_8_1_ba1d35c1::operator()
                (&push_back_arg_info,&this->m_name,(int)__n,arg_name,type);
      if (*type == OBJ_NAMED_PARAMS) {
        pRVar1 = (pvVar4->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pRVar5 = (pvVar4->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                      super__Vector_impl_data._M_start; pRVar5 != pRVar1; pRVar5 = pRVar5 + 1) {
          str_01._M_str = (char *)0x7c;
          str_01._M_len = (size_t)(pRVar5->m_names)._M_dataplus._M_p;
          util::SplitString_abi_cxx11_
                    (&inner_names,(util *)(pRVar5->m_names)._M_string_length,str_01,(char)in_R8);
          pbVar2 = inner_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (arg_name_00 = inner_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; arg_name_00 != pbVar2;
              arg_name_00 = arg_name_00 + 1) {
            in_R8 = &pRVar5->m_type;
            GetArgMap::anon_class_8_1_ba1d35c1::operator()
                      (&push_back_arg_info,&this->m_name,(int)__n,arg_name_00,&pRVar5->m_type);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&inner_names);
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&arg_names);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue RPCHelpMan::GetArgMap() const
{
    UniValue arr{UniValue::VARR};

    auto push_back_arg_info = [&arr](const std::string& rpc_name, int pos, const std::string& arg_name, const RPCArg::Type& type) {
        UniValue map{UniValue::VARR};
        map.push_back(rpc_name);
        map.push_back(pos);
        map.push_back(arg_name);
        map.push_back(type == RPCArg::Type::STR ||
                      type == RPCArg::Type::STR_HEX);
        arr.push_back(std::move(map));
    };

    for (int i{0}; i < int(m_args.size()); ++i) {
        const auto& arg = m_args.at(i);
        std::vector<std::string> arg_names = SplitString(arg.m_names, '|');
        for (const auto& arg_name : arg_names) {
            push_back_arg_info(m_name, i, arg_name, arg.m_type);
            if (arg.m_type == RPCArg::Type::OBJ_NAMED_PARAMS) {
                for (const auto& inner : arg.m_inner) {
                    std::vector<std::string> inner_names = SplitString(inner.m_names, '|');
                    for (const std::string& inner_name : inner_names) {
                        push_back_arg_info(m_name, i, inner_name, inner.m_type);
                    }
                }
            }
        }
    }
    return arr;
}